

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void FTransform_SSE2(uint8_t *src,uint8_t *ref,int16_t *out)

{
  undefined8 *in_RDI;
  __m128i v32;
  __m128i v01;
  __m128i row23;
  __m128i row01;
  __m128i ref_1_16b;
  __m128i ref_0_16b;
  __m128i src_1_16b;
  __m128i src_0_16b;
  __m128i ref_1;
  __m128i ref_0;
  __m128i ref3;
  __m128i ref2;
  __m128i ref1;
  __m128i ref0;
  __m128i src_1;
  __m128i src_0;
  __m128i src3;
  __m128i src2;
  __m128i src1;
  __m128i src0;
  __m128i zero;
  int16_t *out_00;
  __m128i *v32_00;
  __m128i *v01_00;
  
  v01_00 = (__m128i *)0x0;
  out_00 = (int16_t *)*in_RDI;
  v32_00 = (__m128i *)0x0;
  FTransformPass1_SSE2((__m128i *)in_RDI[4],(__m128i *)0x0,(__m128i *)in_RDI[8],(__m128i *)0x0);
  FTransformPass2_SSE2(v01_00,v32_00,out_00);
  return;
}

Assistant:

static void FTransform_SSE2(const uint8_t* src, const uint8_t* ref,
                            int16_t* out) {
  const __m128i zero = _mm_setzero_si128();
  // Load src.
  const __m128i src0 = _mm_loadl_epi64((const __m128i*)&src[0 * BPS]);
  const __m128i src1 = _mm_loadl_epi64((const __m128i*)&src[1 * BPS]);
  const __m128i src2 = _mm_loadl_epi64((const __m128i*)&src[2 * BPS]);
  const __m128i src3 = _mm_loadl_epi64((const __m128i*)&src[3 * BPS]);
  // 00 01 02 03 *
  // 10 11 12 13 *
  // 20 21 22 23 *
  // 30 31 32 33 *
  // Shuffle.
  const __m128i src_0 = _mm_unpacklo_epi16(src0, src1);
  const __m128i src_1 = _mm_unpacklo_epi16(src2, src3);
  // 00 01 10 11 02 03 12 13 * * ...
  // 20 21 30 31 22 22 32 33 * * ...

  // Load ref.
  const __m128i ref0 = _mm_loadl_epi64((const __m128i*)&ref[0 * BPS]);
  const __m128i ref1 = _mm_loadl_epi64((const __m128i*)&ref[1 * BPS]);
  const __m128i ref2 = _mm_loadl_epi64((const __m128i*)&ref[2 * BPS]);
  const __m128i ref3 = _mm_loadl_epi64((const __m128i*)&ref[3 * BPS]);
  const __m128i ref_0 = _mm_unpacklo_epi16(ref0, ref1);
  const __m128i ref_1 = _mm_unpacklo_epi16(ref2, ref3);

  // Convert both to 16 bit.
  const __m128i src_0_16b = _mm_unpacklo_epi8(src_0, zero);
  const __m128i src_1_16b = _mm_unpacklo_epi8(src_1, zero);
  const __m128i ref_0_16b = _mm_unpacklo_epi8(ref_0, zero);
  const __m128i ref_1_16b = _mm_unpacklo_epi8(ref_1, zero);

  // Compute the difference.
  const __m128i row01 = _mm_sub_epi16(src_0_16b, ref_0_16b);
  const __m128i row23 = _mm_sub_epi16(src_1_16b, ref_1_16b);
  __m128i v01, v32;

  // First pass
  FTransformPass1_SSE2(&row01, &row23, &v01, &v32);

  // Second pass
  FTransformPass2_SSE2(&v01, &v32, out);
}